

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRItemFactory.h
# Opt level: O1

VRGraphicsToolkit * __thiscall
MinVR::VRItemFactory::createItem<MinVR::VRGraphicsToolkit>
          (VRItemFactory *this,VRMainInterface *vrMain,VRDataIndex *config,string *dataContainer)

{
  char *__s1;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  iVar1 = (*this->_vptr_VRItemFactory[2])();
  __s1 = *(char **)(CONCAT44(extraout_var,iVar1) + 8);
  if (__s1 != "N5MinVR17VRGraphicsToolkitE") {
    if (*__s1 != '*') {
      iVar1 = strcmp(__s1,"N5MinVR17VRGraphicsToolkitE");
      if (iVar1 == 0) goto LAB_00125218;
    }
    return (VRGraphicsToolkit *)0x0;
  }
LAB_00125218:
  iVar1 = (*this->_vptr_VRItemFactory[3])(this,vrMain,config,dataContainer);
  return (VRGraphicsToolkit *)CONCAT44(extraout_var_00,iVar1);
}

Assistant:

T* createItem(VRMainInterface *vrMain, VRDataIndex *config, const std::string &dataContainer) {

    if (getType() == typeid(T)) {

      VRSpecificItemFactory<T>* factory = static_cast<VRSpecificItemFactory<T>*>(this);
			if(factory) {

				return factory->create(vrMain, config, dataContainer);
			}
		}

		return NULL;
	}